

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O0

VkImageAspectFlagBits vkt::anon_unknown_0::getPrimaryImageAspect(ChannelOrder order)

{
  ChannelOrder order_local;
  
  if (order != D) {
    if (order == S) {
      return VK_IMAGE_ASPECT_STENCIL_BIT;
    }
    if (order != DS) {
      return VK_IMAGE_ASPECT_COLOR_BIT;
    }
  }
  return VK_IMAGE_ASPECT_DEPTH_BIT;
}

Assistant:

VkImageAspectFlagBits getPrimaryImageAspect (tcu::TextureFormat::ChannelOrder order)
{
	DE_STATIC_ASSERT(tcu::TextureFormat::CHANNELORDER_LAST == 21);

	switch (order)
	{
		case tcu::TextureFormat::D:
		case tcu::TextureFormat::DS:
			return VK_IMAGE_ASPECT_DEPTH_BIT;

		case tcu::TextureFormat::S:
			return VK_IMAGE_ASPECT_STENCIL_BIT;

		default:
			return VK_IMAGE_ASPECT_COLOR_BIT;
	}
}